

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O1

char * BN_bn2dec(BIGNUM *a)

{
  uint8_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  BIGNUM *pBVar5;
  int iVar6;
  int iVar7;
  uint8_t *puVar8;
  BIGNUM *a_00;
  ulong uVar9;
  uint8_t *puVar10;
  uint uVar11;
  ulong uVar12;
  uint8_t *puVar13;
  uint8_t *data;
  size_t len;
  ScopedCBB cbb;
  uint8_t *local_78;
  BIGNUM *local_70;
  size_t local_68;
  CBB local_60;
  
  CBB_zero(&local_60);
  iVar6 = CBB_init(&local_60,0x10);
  if (iVar6 != 0) {
    iVar6 = CBB_add_u8(&local_60,'\0');
    puVar13 = (uint8_t *)0x0;
    if (iVar6 == 0) goto LAB_00177344;
    iVar6 = BN_is_zero((BIGNUM *)a);
    if (iVar6 == 0) {
      a_00 = BN_dup(a);
      pBVar5 = a;
      if (a_00 != (BIGNUM *)0x0) {
        do {
          local_70 = pBVar5;
          iVar6 = BN_is_zero((BIGNUM *)a_00);
          if (iVar6 != 0) {
            BN_free(a_00);
            a = local_70;
            goto LAB_0017718b;
          }
          uVar9 = BN_div_word(a_00,10000000000000000000);
          if (uVar9 == 0xffffffffffffffff) break;
          iVar6 = BN_is_zero((BIGNUM *)a_00);
          bVar4 = uVar9 == 0 && iVar6 != 0;
          if (uVar9 != 0 || iVar6 == 0) {
            auVar2._8_8_ = 0;
            auVar2._0_8_ = uVar9;
            iVar7 = CBB_add_u8(&local_60,
                               (char)uVar9 +
                               ((byte)(SUB164(auVar2 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe)
                               * -5 | 0x30);
            if (iVar7 != 0) {
              uVar11 = 0;
              uVar12 = uVar9;
              do {
                uVar9 = uVar12 / 10;
                bVar4 = uVar12 < 10 && iVar6 != 0 || 0x11 < uVar11;
                if (bVar4) goto LAB_00177327;
                auVar3._8_8_ = 0;
                auVar3._0_8_ = uVar9;
                uVar11 = uVar11 + 1;
                iVar7 = CBB_add_u8(&local_60,
                                   (char)uVar9 +
                                   SUB161(auVar3 * ZEXT816(0x199999999999999a),8) * -10 | 0x30);
                uVar12 = uVar9;
              } while (iVar7 != 0);
            }
            if (!bVar4) break;
          }
LAB_00177327:
          if (uVar9 != 0) {
            __assert_fail("word == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/convert.cc"
                          ,0xe6,"char *BN_bn2dec(const BIGNUM *)");
          }
          pBVar5 = local_70;
        } while (bVar4);
        if (a_00 != (BIGNUM *)0x0) {
          BN_free(a_00);
        }
      }
    }
    else {
      iVar6 = CBB_add_u8(&local_60,'0');
      if (iVar6 != 0) {
LAB_0017718b:
        iVar6 = BN_is_negative((BIGNUM *)a);
        if (((iVar6 == 0) || (iVar6 = CBB_add_u8(&local_60,'-'), iVar6 != 0)) &&
           (iVar6 = CBB_finish(&local_60,&local_78,&local_68), iVar6 != 0)) {
          puVar10 = local_78 + (local_68 - 1);
          puVar13 = local_78;
          if (local_78 < puVar10 && local_68 != 0) {
            do {
              puVar8 = local_78 + 1;
              uVar1 = *local_78;
              *local_78 = *puVar10;
              *puVar10 = uVar1;
              puVar10 = puVar10 + -1;
              local_78 = puVar8;
            } while (puVar8 < puVar10);
          }
          goto LAB_00177344;
        }
      }
    }
  }
  puVar13 = (uint8_t *)0x0;
LAB_00177344:
  CBB_cleanup(&local_60);
  return (char *)puVar13;
}

Assistant:

char *BN_bn2dec(const BIGNUM *a) {
  // It is easier to print strings little-endian, so we assemble it in reverse
  // and fix at the end.
  bssl::ScopedCBB cbb;
  if (!CBB_init(cbb.get(), 16) || //
      !CBB_add_u8(cbb.get(), 0 /* trailing NUL */)) {
    return nullptr;
  }

  if (BN_is_zero(a)) {
    if (!CBB_add_u8(cbb.get(), '0')) {
      return nullptr;
    }
  } else {
    bssl::UniquePtr<BIGNUM> copy(BN_dup(a));
    if (copy == nullptr) {
      return nullptr;
    }

    while (!BN_is_zero(copy.get())) {
      BN_ULONG word = BN_div_word(copy.get(), BN_DEC_CONV);
      if (word == (BN_ULONG)-1) {
        return nullptr;
      }

      const int add_leading_zeros = !BN_is_zero(copy.get());
      for (int i = 0; i < BN_DEC_NUM && (add_leading_zeros || word != 0); i++) {
        if (!CBB_add_u8(cbb.get(), '0' + word % 10)) {
          return nullptr;
        }
        word /= 10;
      }
      assert(word == 0);
    }
  }

  if (BN_is_negative(a) && //
      !CBB_add_u8(cbb.get(), '-')) {
    return nullptr;
  }

  uint8_t *data;
  size_t len;
  if (!CBB_finish(cbb.get(), &data, &len)) {
    return nullptr;
  }

  std::reverse(data, data + len);
  return reinterpret_cast<char *>(data);
}